

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O1

void Gia_ManEquivUpdatePointers(Gia_Man_t *p,Gia_Man_t *pNew)

{
  uint uVar1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  long lVar4;
  
  uVar1 = p->nObjs;
  if ((0 < (int)uVar1) && (pGVar3 = p->pObjs, pGVar3 != (Gia_Obj_t *)0x0)) {
    lVar4 = 0;
    do {
      uVar2 = *(uint *)((long)&pGVar3->Value + lVar4);
      if (uVar2 != 0xffffffff) {
        if ((int)uVar2 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        if (pNew->nObjs <= (int)(uVar2 >> 1)) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                        ,0x1cc,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if ((pNew->pObjs[uVar2 >> 1].field_0x3 & 0x40) != 0) {
          *(undefined4 *)((long)&pGVar3->Value + lVar4) = 0xffffffff;
        }
      }
      lVar4 = lVar4 + 0xc;
    } while ((ulong)uVar1 * 0xc != lVar4);
  }
  return;
}

Assistant:

void Gia_ManEquivUpdatePointers( Gia_Man_t * p, Gia_Man_t * pNew )
{
    Gia_Obj_t * pObj, * pObjNew;
    int i;
    Gia_ManForEachObj( p, pObj, i )
    {
        if ( !~pObj->Value )
            continue;
        pObjNew = Gia_ManObj( pNew, Abc_Lit2Var(pObj->Value) );
        if ( pObjNew->fMark0 )
            pObj->Value = ~0;
    }
}